

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall restincurl::Request::SetRequestType(Request *this)

{
  headers_t pcVar1;
  Exception *this_00;
  char *pcVar2;
  EasyHandle EVar3;
  undefined8 uStack_60;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  switch(this->request_type_) {
  case GET:
    EVar3.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    uStack_60 = 0x50;
    break;
  case PUT:
    pcVar1 = (headers_t)curl_slist_append(this->headers_,"Transfer-Encoding: chunked");
    this->headers_ = pcVar1;
    EVar3.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    uStack_60 = 0x2e;
    break;
  case POST:
    pcVar1 = (headers_t)curl_slist_append(this->headers_,"Transfer-Encoding: chunked");
    this->headers_ = pcVar1;
    curl_easy_setopt(((this->eh_)._M_t.
                      super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
                      .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_
                     ,0x2e,0);
    EVar3.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    uStack_60 = 0x2f;
    break;
  case HEAD:
    EVar3.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    uStack_60 = 0x2c;
    break;
  case DELETE:
    EVar3.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar2 = "DELETE";
    goto LAB_00115e40;
  case PATCH:
    pcVar1 = (headers_t)curl_slist_append(this->headers_,"Transfer-Encoding: chunked");
    this->headers_ = pcVar1;
    EVar3.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar2 = "PATCH";
    goto LAB_00115e40;
  case OPTIONS:
    EVar3.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    pcVar2 = "OPTIONS";
LAB_00115e40:
    uStack_60 = 0x2734;
    goto LAB_00115e45;
  case POST_MIME:
    InitMime(this);
    pcVar2 = (char *)this->mime_;
    EVar3.handle_ =
         ((this->eh_)._M_t.
          super___uniq_ptr_impl<restincurl::EasyHandle,_std::default_delete<restincurl::EasyHandle>_>
          ._M_t.
          super__Tuple_impl<0UL,_restincurl::EasyHandle_*,_std::default_delete<restincurl::EasyHandle>_>
          .super__Head_base<0UL,_restincurl::EasyHandle_*,_false>._M_head_impl)->handle_;
    uStack_60 = 0x281d;
    goto LAB_00115e45;
  default:
    this_00 = (Exception *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&sStack_58,this->request_type_);
    std::operator+(&local_38,"Unsupported request type",&sStack_58);
    Exception::Exception(this_00,&local_38);
    __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar2 = (char *)0x1;
LAB_00115e45:
  curl_easy_setopt(EVar3.handle_,uStack_60,pcVar2);
  return;
}

Assistant:

void SetRequestType() {
            switch(request_type_) {
                case RequestType::GET:
                    curl_easy_setopt(*eh_, CURLOPT_HTTPGET, 1L);
                    break;
                case RequestType::PUT:
                    headers_ = curl_slist_append(headers_, "Transfer-Encoding: chunked");
                    curl_easy_setopt(*eh_, CURLOPT_UPLOAD, 1L);
                    break;
                case RequestType::POST:
                    headers_ = curl_slist_append(headers_, "Transfer-Encoding: chunked");
                    curl_easy_setopt(*eh_, CURLOPT_UPLOAD, 0L);
                    curl_easy_setopt(*eh_, CURLOPT_POST, 1L);
                    break;
                case RequestType::HEAD:
                    curl_easy_setopt(*eh_, CURLOPT_NOBODY, 1L);
                    break;
                case RequestType::OPTIONS:
                    curl_easy_setopt(*eh_, CURLOPT_CUSTOMREQUEST, "OPTIONS");
                    break;
                case RequestType::PATCH:
                    headers_ = curl_slist_append(headers_, "Transfer-Encoding: chunked");
                    curl_easy_setopt(*eh_, CURLOPT_CUSTOMREQUEST, "PATCH");
                    break;
                case RequestType::DELETE:
                    curl_easy_setopt(*eh_, CURLOPT_CUSTOMREQUEST, "DELETE");
                    break;
                case RequestType::POST_MIME:
                    InitMime();
                    curl_easy_setopt(*eh_, CURLOPT_MIMEPOST, mime_);
                    break;
                default:
                    throw Exception("Unsupported request type" + std::to_string(static_cast<int>(request_type_)));
            }
        }